

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::UnitTestImpl::RegisterParameterizedTests(UnitTestImpl *this)

{
  UnitTestImpl *this_local;
  
  if ((this->parameterized_tests_registered_ & 1U) == 0) {
    ParameterizedTestSuiteRegistry::RegisterTests(&this->parameterized_test_registry_);
    TypeParameterizedTestSuiteRegistry::CheckForInstantiations
              (&this->type_parameterized_test_registry_);
    this->parameterized_tests_registered_ = true;
  }
  return;
}

Assistant:

void UnitTestImpl::RegisterParameterizedTests() {
  if (!parameterized_tests_registered_) {
    parameterized_test_registry_.RegisterTests();
    type_parameterized_test_registry_.CheckForInstantiations();
    parameterized_tests_registered_ = true;
  }
}